

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderpass.cpp
# Opt level: O2

bool RenderPassCreate(vector<RenderPass,_std::allocator<RenderPass>_> *render_passes,string *error)

{
  pointer pTVar1;
  uint __line;
  bool bVar2;
  GLenum GVar3;
  pointer shader_program;
  char *__assertion;
  pointer pTVar4;
  allocator<char> local_69;
  pointer local_68;
  string *local_60;
  pointer local_58;
  string local_50;
  
  local_68 = (render_passes->super__Vector_base<RenderPass,_std::allocator<RenderPass>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  shader_program =
       (render_passes->super__Vector_base<RenderPass,_std::allocator<RenderPass>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_60 = error;
  while (shader_program != local_68) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "\nin vec2 position;\nvoid main() {\n    gl_Position = vec4(position, 0.0, 1.0);\n}\n"
               ,&local_69);
    bVar2 = ShaderProgramCreate(&shader_program->Program,&shader_program->ShaderSource,&local_50,
                                local_60);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar2) break;
    if (shader_program->IsMain == false) {
      (*glad_glGenFramebuffers)(1,&shader_program->FBO);
      (*glad_glBindFramebuffer)(0x8d40,shader_program->FBO);
      (*glad_glGenTextures)(1,&shader_program->TextureId);
      (*glad_glBindTexture)(0xde1,shader_program->TextureId);
      if (shader_program->Width == 0) {
        __assertion = "render_pass.Width != 0";
        __line = 0x31;
LAB_0011d60a:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/renderpass.cpp"
                      ,__line,"bool RenderPassCreate(std::vector<RenderPass> &, std::string &)");
      }
      if (shader_program->Height == 0) {
        __assertion = "render_pass.Height != 0";
        __line = 0x32;
        goto LAB_0011d60a;
      }
      (*glad_glTexImage2D)
                (0xde1,0,0x1908,shader_program->Width,shader_program->Height,0,0x1908,0x1401,
                 (void *)0x0);
      (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
      (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
      (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
      (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
      (*glad_glFramebufferTexture2D)(0x8d40,0x8ce0,0xde1,shader_program->TextureId,0);
      GVar3 = (*glad_glCheckFramebufferStatus)(0x8d40);
      if (GVar3 != 0x8cd5) {
        __assertion = "glCheckFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE";
        __line = 0x3d;
        goto LAB_0011d60a;
      }
      (*glad_glBindFramebuffer)(0x8d40,0);
      (*glad_glBindTexture)(0xde1,0);
    }
    pTVar1 = (shader_program->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_58 = shader_program;
    for (pTVar4 = (shader_program->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>.
                  _M_impl.super__Vector_impl_data._M_start; pTVar4 != pTVar1; pTVar4 = pTVar4 + 1) {
      (*glad_glGenTextures)(1,&pTVar4->Id);
      (*glad_glBindTexture)(0xde1,pTVar4->Id);
      if (pTVar4->Width == 0) {
        __assertion = "texture.Width != 0";
        __line = 0x47;
        goto LAB_0011d60a;
      }
      if (pTVar4->Height == 0) {
        __assertion = "texture.Height != 0";
        __line = 0x48;
        goto LAB_0011d60a;
      }
      if (pTVar4->Data == (uchar *)0x0) {
        __assertion = "texture.Data";
        __line = 0x49;
        goto LAB_0011d60a;
      }
      (*glad_glTexImage2D)(0xde1,0,0x1908,pTVar4->Width,pTVar4->Height,0,0x1908,0x1401,pTVar4->Data)
      ;
      (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
      (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
      (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
      (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
      (*glad_glBindTexture)(0xde1,0);
    }
    shader_program = local_58 + 1;
  }
  return shader_program == local_68;
}

Assistant:

bool RenderPassCreate(std::vector<RenderPass>& render_passes, std::string& error) {
    for (auto& render_pass : render_passes) {
        if (!ShaderProgramCreate(render_pass.Program, render_pass.ShaderSource, DefaultVertexShader, error)) {
            return false;
        }

        if (!render_pass.IsMain) {
            glGenFramebuffers(1, &render_pass.FBO);
            glBindFramebuffer(GL_FRAMEBUFFER, render_pass.FBO);

            glGenTextures(1, &render_pass.TextureId);
            glBindTexture(GL_TEXTURE_2D, render_pass.TextureId);

            assert(render_pass.Width != 0);
            assert(render_pass.Height != 0);

            glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, render_pass.Width, render_pass.Height, 0, GL_RGBA, GL_UNSIGNED_BYTE, NULL);

            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

            glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, render_pass.TextureId, 0);

            assert(glCheckFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

            glBindFramebuffer(GL_FRAMEBUFFER, 0);
            glBindTexture(GL_TEXTURE_2D, 0);
        }

        for (Texture& texture : render_pass.Textures) {
            glGenTextures(1, &texture.Id);
            glBindTexture(GL_TEXTURE_2D, texture.Id);

            assert(texture.Width != 0);
            assert(texture.Height != 0);
            assert(texture.Data);

            glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, texture.Width, texture.Height, 0, GL_RGBA, GL_UNSIGNED_BYTE, texture.Data);

            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

            glBindTexture(GL_TEXTURE_2D, 0);
        }
    }

    return true;
}